

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBucket.cpp
# Opt level: O2

void __thiscall
Memory::HeapBucketT<Memory::SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes>_>::
Verify(HeapBucketT<Memory::SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes>_> *this)

{
  anon_class_16_2_364abe19 fn;
  undefined2 local_48;
  undefined1 local_46;
  RecyclerVerifyListConsistencyData recyclerVerifyListConsistencyData;
  
  HeapBucketT<Memory::SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes>>::
  ForEachAllocator<Memory::HeapBucketT<Memory::SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes>>::UpdateAllocators()::_lambda(Memory::SmallHeapBlockAllocator<Memory::SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes>>*)_1_>
            ();
  recyclerVerifyListConsistencyData.smallBlockVerifyListConsistencyData.expectFull = false;
  recyclerVerifyListConsistencyData.smallBlockVerifyListConsistencyData.expectDispose = false;
  recyclerVerifyListConsistencyData.smallBlockVerifyListConsistencyData.
  hasSetupVerifyListConsistencyData = false;
  recyclerVerifyListConsistencyData.smallBlockVerifyListConsistencyData._3_5_ = 0;
  local_48 = 1;
  local_46 = 1;
  HeapBlockList::
  ForEach<Memory::SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes>,Memory::HeapBucketT<Memory::SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes>>::Verify()::_lambda(Memory::SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes>*)_1_>
            (this->fullBlockList,(RecyclerVerifyListConsistencyData *)&local_48);
  recyclerVerifyListConsistencyData.smallBlockVerifyListConsistencyData._0_8_ =
       this->nextAllocableBlockHead;
  local_48 = 1;
  local_46 = 1;
  fn.recyclerVerifyListConsistencyData = (RecyclerVerifyListConsistencyData *)&local_48;
  fn.this = this;
  HeapBlockList::
  ForEach<Memory::SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes>,Memory::HeapBucketT<Memory::SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes>>::Verify()::_lambda(Memory::SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes>*)_2_>
            (this->heapBlockList,fn);
  return;
}

Assistant:

void
HeapBucketT<TBlockType>::Verify()
{
    UpdateAllocators();
#if DBG
    RecyclerVerifyListConsistencyData recyclerVerifyListConsistencyData;

    if (TBlockType::HeapBlockAttributes::IsSmallBlock)
    {
        recyclerVerifyListConsistencyData.smallBlockVerifyListConsistencyData.SetupVerifyListConsistencyData((SmallHeapBlock*) nullptr, true, false);
    }
    else if (TBlockType::HeapBlockAttributes::IsMediumBlock)
    {
        recyclerVerifyListConsistencyData.mediumBlockVerifyListConsistencyData.SetupVerifyListConsistencyData((MediumHeapBlock*) nullptr, true, false);
    }
    else
    {
        Assert(false);
    }
#endif

    HeapBlockList::ForEach(fullBlockList, [DebugOnly(&recyclerVerifyListConsistencyData)](TBlockType * heapBlock)
    {
        DebugOnly(VerifyBlockConsistencyInList(heapBlock, recyclerVerifyListConsistencyData));
        heapBlock->Verify();
    });

#if ENABLE_ALLOCATIONS_DURING_CONCURRENT_SWEEP && SUPPORT_WIN32_SLIST
    if (CONFIG_FLAG_RELEASE(EnableConcurrentSweepAlloc) && !this->IsAnyFinalizableBucket())
    {
#if DBG
        if (TBlockType::HeapBlockAttributes::IsSmallBlock)
        {
            recyclerVerifyListConsistencyData.smallBlockVerifyListConsistencyData.SetupVerifyListConsistencyData((SmallHeapBlock*) nullptr, true, false);
        }
        else if (TBlockType::HeapBlockAttributes::IsMediumBlock)
        {
            recyclerVerifyListConsistencyData.mediumBlockVerifyListConsistencyData.SetupVerifyListConsistencyData((MediumHeapBlock*) nullptr, true, false);
        }
        else
        {
            Assert(false);
        }
#endif

        HeapBlockList::ForEach(sweepableHeapBlockList, [DebugOnly(&recyclerVerifyListConsistencyData)](TBlockType * heapBlock)
        {
            DebugOnly(VerifyBlockConsistencyInList(heapBlock, recyclerVerifyListConsistencyData));
            heapBlock->Verify();
        });
    }
#endif

#if DBG
    if (TBlockType::HeapBlockAttributes::IsSmallBlock)
    {
        recyclerVerifyListConsistencyData.smallBlockVerifyListConsistencyData.SetupVerifyListConsistencyData((SmallHeapBlock*) this->nextAllocableBlockHead, true, false);
    }
    else if (TBlockType::HeapBlockAttributes::IsMediumBlock)
    {
        recyclerVerifyListConsistencyData.mediumBlockVerifyListConsistencyData.SetupVerifyListConsistencyData((MediumHeapBlock*) this->nextAllocableBlockHead, true, false);
    }
    else
    {
        Assert(false);
    }
#endif

    HeapBlockList::ForEach(heapBlockList, [this, DebugOnly(&recyclerVerifyListConsistencyData)](TBlockType * heapBlock)
    {
        DebugOnly(VerifyBlockConsistencyInList(heapBlock, recyclerVerifyListConsistencyData));
        char * bumpAllocateAddress = nullptr;
        this->ForEachAllocator([heapBlock, &bumpAllocateAddress](TBlockAllocatorType * allocator)
        {
            if (allocator->GetHeapBlock() == heapBlock && allocator->GetEndAddress() != nullptr)
            {
                Assert(bumpAllocateAddress == nullptr);
                bumpAllocateAddress = (char *)allocator->GetFreeObjectList();
            }
        });
        if (bumpAllocateAddress != nullptr)
        {
            heapBlock->VerifyBumpAllocated(bumpAllocateAddress);
        }
        else
        {
            heapBlock->Verify(false);
        }
    });
}